

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void luaH_newkey(lua_State *L,Table *t,TValue *key,TValue *value)

{
  Node *pNVar1;
  int *piVar2;
  lua_Number n;
  byte bVar3;
  Node *pNVar4;
  lu_byte lVar5;
  lu_byte lVar6;
  undefined2 uVar7;
  uint asize;
  int iVar8;
  uint uVar9;
  int iVar10;
  Node *pNVar11;
  Node *pNVar12;
  Node *pNVar13;
  TValue *pTVar14;
  uint uVar15;
  uint uVar16;
  TValue *io2;
  uint ause;
  long lVar17;
  long lVar18;
  char *fmt;
  uint uVar19;
  int iVar20;
  Node *n_;
  int iVar21;
  uint uVar22;
  bool bVar23;
  lua_Integer k;
  TValue aux;
  Value local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Value local_40;
  undefined1 local_38;
  
  if ((key->tt_ & 0xf) == 0) {
    fmt = "table index is nil";
LAB_0011443c:
    luaG_runerror(L,fmt);
  }
  if (key->tt_ == 0x13) {
    n = (key->value_).n;
    iVar8 = luaV_flttointeger(n,&local_c8.i,F2Ieq);
    if (iVar8 == 0) {
      if (NAN(n)) {
        fmt = "table index is NaN";
        goto LAB_0011443c;
      }
    }
    else {
      key = (TValue *)&local_40;
      local_40 = local_c8;
      local_38 = 3;
    }
  }
  if ((value->tt_ & 0xf) == 0) {
    return;
  }
  pNVar11 = mainpositionTV(t,key);
  pNVar4 = t->lastfree;
  if (((pNVar11->u).tt_ & 0xf) == 0) {
    if (pNVar4 == (Node *)0x0) goto LAB_001141bc;
  }
  else {
    if (pNVar4 == (Node *)0x0) {
LAB_001141bc:
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8.gc = (GCObject *)0x0;
      uStack_c0 = 0;
      uVar9 = luaH_realasize(t);
      t->alimit = uVar9;
      t->flags = t->flags & 0x7f;
      lVar18 = 0;
      uVar15 = 1;
      iVar8 = 0;
      uVar22 = 1;
      do {
        uVar16 = uVar22;
        if ((uVar9 < uVar22) && (uVar16 = uVar9, uVar9 < uVar15)) break;
        iVar20 = 0;
        if (uVar15 <= uVar16) {
          uVar15 = uVar15 - 1;
          iVar20 = 0;
          do {
            iVar20 = (iVar20 + 1) - (uint)((t->array[uVar15].tt_ & 0xf) == 0);
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
          uVar15 = uVar16 + 1;
        }
        piVar2 = (int *)((long)&local_c8 + lVar18 * 4);
        *piVar2 = *piVar2 + iVar20;
        iVar8 = iVar8 + iVar20;
        lVar18 = lVar18 + 1;
        uVar22 = uVar22 * 2;
      } while (lVar18 != 0x20);
      lVar18 = (ulong)(uint)~(-1 << (t->lsizenode & 0x1f)) * 0x18 + 0x10;
      iVar20 = 0;
      iVar21 = 0;
      do {
        pNVar4 = t->node;
        if ((*(byte *)((long)pNVar4 + lVar18 + -8) & 0xf) != 0) {
          if (*(char *)((long)pNVar4 + lVar18 + -7) == '\x03') {
            bVar23 = 0xffffffff7fffffff < *(long *)((long)pNVar4 + lVar18) - 0x80000001U;
            if (bVar23) {
              iVar10 = luaO_ceillog2((uint)*(long *)((long)pNVar4 + lVar18));
              piVar2 = (int *)((long)&local_c8 + (long)iVar10 * 4);
              *piVar2 = *piVar2 + 1;
            }
            iVar21 = iVar21 + (uint)bVar23;
          }
          iVar20 = iVar20 + 1;
        }
        lVar18 = lVar18 + -0x18;
      } while (lVar18 != -8);
      uVar22 = iVar21 + iVar8;
      if (((Value *)((long)key + 8))->ub == '\x03') {
        bVar23 = (code *)0xffffffff7fffffff < *(lua_CFunction *)key + -0x80000001;
        if (bVar23) {
          iVar21 = luaO_ceillog2((uint)*(lua_CFunction *)key);
          piVar2 = (int *)((long)&local_c8 + (long)iVar21 * 4);
          *piVar2 = *piVar2 + 1;
        }
        uVar22 = uVar22 + bVar23;
      }
      uVar9 = 1;
      lVar18 = 0;
      uVar16 = 0;
      uVar15 = 0;
      uVar19 = 0;
      do {
        if (uVar22 <= uVar9 >> 1) break;
        uVar19 = uVar19 + *(int *)((long)&local_c8 + lVar18 * 4);
        if (uVar9 >> 1 < uVar19) {
          uVar15 = uVar19;
          uVar16 = uVar9;
        }
        lVar18 = lVar18 + 1;
        uVar9 = uVar9 * 2;
      } while (lVar18 != 0x20);
      luaH_resize(L,t,uVar16,((iVar8 + iVar20) - uVar15) + 1);
      pTVar14 = luaH_get(t,key);
      if (pTVar14->tt_ == ' ') {
        luaH_newkey(L,t,key,value);
        return;
      }
      pTVar14->value_ = value->value_;
      pTVar14->tt_ = value->tt_;
      return;
    }
    lVar18 = 0;
    do {
      lVar17 = lVar18;
      if ((Node *)((long)pNVar4 + lVar17) <= t->node) goto LAB_001141bc;
      t->lastfree = (Node *)((long)pNVar4 + lVar17 + -0x18);
      lVar18 = lVar17 + -0x18;
    } while (*(char *)((long)pNVar4 + lVar17 + -0xf) != '\0');
    local_c8 = (pNVar11->u).key_val;
    uStack_c0 = CONCAT71(uStack_c0._1_7_,(pNVar11->u).key_tt);
    pNVar12 = mainpositionTV(t,(TValue *)&local_c8);
    pNVar1 = (Node *)((long)pNVar4 + lVar18);
    if (pNVar12 == pNVar11) {
      if ((long)(pNVar11->u).next != 0) {
        *(int *)((long)pNVar4 + lVar17 + -0xc) =
             (int)((ulong)((long)pNVar11 +
                          (((long)(pNVar11->u).next * 0x18 - (long)pNVar4) - lVar18)) >> 3) *
             -0x55555555;
      }
      (pNVar11->u).next = (int)((ulong)((long)pNVar4 + (lVar18 - (long)pNVar11)) >> 3) * -0x55555555
      ;
      pNVar11 = pNVar1;
    }
    else {
      do {
        pNVar13 = pNVar12;
        pNVar12 = pNVar13 + (pNVar13->u).next;
      } while (pNVar13 + (pNVar13->u).next != pNVar11);
      (pNVar13->u).next = (int)((ulong)((long)pNVar4 + (lVar18 - (long)pNVar13)) >> 3) * -0x55555555
      ;
      (pNVar1->u).key_val = (pNVar11->u).key_val;
      lVar5 = *(lu_byte *)((long)pNVar11 + 8);
      lVar6 = *(lu_byte *)((long)pNVar11 + 9);
      uVar7 = *(undefined2 *)((long)pNVar11 + 10);
      iVar8 = *(int *)((long)pNVar11 + 0xc);
      (pNVar1->u).value_ = (pNVar11->u).value_;
      *(lu_byte *)((long)pNVar1 + 8) = lVar5;
      *(lu_byte *)((long)pNVar1 + 9) = lVar6;
      *(undefined2 *)((long)pNVar1 + 10) = uVar7;
      *(int *)((long)pNVar1 + 0xc) = iVar8;
      if ((pNVar11->u).next != 0) {
        piVar2 = (int *)((long)pNVar4 + lVar17 + -0xc);
        *piVar2 = *piVar2 + (int)((ulong)((long)pNVar11 + (-lVar18 - (long)pNVar4)) >> 3) *
                            -0x55555555;
        (pNVar11->u).next = 0;
      }
      (pNVar11->u).tt_ = '\x10';
    }
  }
  (pNVar11->u).key_val.f = (lua_CFunction)key->value_;
  bVar3 = ((Value *)((long)key + 8))->ub;
  (pNVar11->u).key_tt = bVar3;
  if ((((bVar3 & 0x40) != 0) && ((t->marked & 0x20) != 0)) &&
     (((*(GCObject **)key)->marked & 0x18) != 0)) {
    luaC_barrierback_(L,(GCObject *)t);
  }
  (pNVar11->u).value_ = value->value_;
  (pNVar11->u).tt_ = value->tt_;
  return;
}

Assistant:

static void luaH_newkey (lua_State *L, Table *t, const TValue *key,
                                                 TValue *value) {
  Node *mp;
  TValue aux;
  if (l_unlikely(ttisnil(key)))
    luaG_runerror(L, "table index is nil");
  else if (ttisfloat(key)) {
    lua_Number f = fltvalue(key);
    lua_Integer k;
    if (luaV_flttointeger(f, &k, F2Ieq)) {  /* does key fit in an integer? */
      setivalue(&aux, k);
      key = &aux;  /* insert it as an integer */
    }
    else if (l_unlikely(luai_numisnan(f)))
      luaG_runerror(L, "table index is NaN");
  }
  if (ttisnil(value))
    return;  /* do not insert nil values */
  mp = mainpositionTV(t, key);
  if (!isempty(gval(mp)) || isdummy(t)) {  /* main position is taken? */
    Node *othern;
    Node *f = getfreepos(t);  /* get a free place */
    if (f == NULL) {  /* cannot find a free place? */
      rehash(L, t, key);  /* grow table */
      /* whatever called 'newkey' takes care of TM cache */
      luaH_set(L, t, key, value);  /* insert key into grown table */
      return;
    }
    lua_assert(!isdummy(t));
    othern = mainpositionfromnode(t, mp);
    if (othern != mp) {  /* is colliding node out of its main position? */
      /* yes; move colliding node into free position */
      while (othern + gnext(othern) != mp)  /* find previous */
        othern += gnext(othern);
      gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
      *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
      if (gnext(mp) != 0) {
        gnext(f) += cast_int(mp - f);  /* correct 'next' */
        gnext(mp) = 0;  /* now 'mp' is free */
      }
      setempty(gval(mp));
    }
    else {  /* colliding node is in its own main position */
      /* new node will go into free position */
      if (gnext(mp) != 0)
        gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
      else lua_assert(gnext(f) == 0);
      gnext(mp) = cast_int(f - mp);
      mp = f;
    }
  }
  setnodekey(L, mp, key);
  luaC_barrierback(L, obj2gco(t), key);
  lua_assert(isempty(gval(mp)));
  setobj2t(L, gval(mp), value);
}